

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void streamout(stringstream *oss,char *s,int length)

{
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(oss + 0x10);
  if (length != 0) {
    std::ostream::write((char *)poVar2,(long)s);
    return;
  }
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,s,sVar1);
    return;
  }
  std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  return;
}

Assistant:

void
streamout(stringstream& oss, const char* s, int length)
{
    // Can't find a way to get stringstream to truncate a stream.
    if (length != 0)
        oss.write(s, length);
    else
        oss << s;
}